

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyImage
          (TextureBorderClampTest *this,Surface *renderedFrame,IterationConfig *config,
          ReferenceParams *samplerParams)

{
  Sampler *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer *ppCVar5;
  Texture2D *pTVar6;
  TestLog *pTVar7;
  byte bVar8;
  ushort uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  pointer pfVar18;
  bool bVar19;
  bool bVar20;
  undefined4 extraout_EAX;
  uint uVar21;
  uint uVar22;
  int iVar23;
  RenderTarget *pRVar24;
  IVec2 (*paIVar25) [4];
  TextureFormat TVar26;
  char *pcVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ConstPixelBufferAccess *pCVar31;
  Surface *pSVar32;
  LookupPrecision *pLVar33;
  uint uVar34;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar35;
  int z;
  TextureBorderClampTest *pTVar36;
  int iVar37;
  void *pvVar38;
  pointer pCVar39;
  int iVar40;
  int iVar47;
  int iVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar50;
  undefined1 auVar44 [16];
  float fVar48;
  float fVar51;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  Texture2DView TVar60;
  Vector<float,_2> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  TextureBorderClampTest *local_500;
  string local_4f8;
  Vec4 resultValue_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  int local_4b8;
  Surface reference;
  string local_480;
  int local_45c;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  srcLevelStorage_2;
  Surface errorMask;
  Vec4 resultValue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [6];
  LookupPrecision local_348;
  Texture2DView effectiveView;
  ConstPixelBufferAccess local_308;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  LodPrecision lodPrecision;
  Vec4 referenceValue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [4];
  ios_base local_230 [264];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  vector<float,_std::allocator<float>_> texCoord;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  Texture2DView effectiveView_1;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  LodPrecision local_88;
  Vec3 local_78;
  IVec4 nonShadowBits;
  byte bVar9;
  byte bVar10;
  
  local_500 = this;
  pRVar24 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar37 = (pRVar24->m_pixelFormat).redBits;
  iVar47 = (pRVar24->m_pixelFormat).greenBits;
  iVar49 = (pRVar24->m_pixelFormat).blueBits;
  iVar35 = (pRVar24->m_pixelFormat).alphaBits;
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&config->p0,&config->p1);
  pTVar36 = local_500;
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 5;
  if ((samplerParams->sampler).compare == COMPAREMODE_NONE) {
    TVar26 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((local_500->m_texture).
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,local_500->m_sampleMode);
    uVar21 = ((TVar26.order & ~A) != sRGB &&
             (((samplerParams->sampler).minFilter & ~NEAREST_MIPMAP_NEAREST) == NEAREST &&
             (samplerParams->sampler).magFilter == NEAREST)) | 0xfffffffe;
    uVar34 = uVar21 + iVar47;
    uVar22 = uVar21 + iVar49;
    uVar28 = uVar21 + iVar35;
    effectiveView._4_4_ = -(uint)(0 < (int)uVar34) & uVar34;
    effectiveView.m_numLevels = -(uint)(0 < (int)(uVar21 + iVar37)) & uVar21 + iVar37;
    effectiveView.m_levels =
         (ConstPixelBufferAccess *)
         CONCAT44(-(uint)(0 < (int)uVar28) & uVar28,-(uint)(0 < (int)uVar22) & uVar22);
    local_348.coordBits.m_data[0] = 0x16;
    local_348.coordBits.m_data[1] = 0x16;
    local_348.coordBits.m_data[2] = 0x16;
    local_348.uvwBits.m_data[0] = 0x10;
    local_348.uvwBits.m_data[1] = 0x10;
    local_348.uvwBits.m_data[2] = 0x10;
    local_348.colorThreshold.m_data[0] = 0.0;
    local_348.colorThreshold.m_data[1] = 0.0;
    local_348.colorThreshold.m_data[2] = 0.0;
    local_348.colorThreshold.m_data[3] = 0.0;
    local_348.colorMask.m_data[0] = true;
    local_348.colorMask.m_data[1] = true;
    local_348.colorMask.m_data[2] = true;
    local_348.colorMask.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)&referenceValue,(IVec4 *)&effectiveView);
    pTVar36 = local_500;
    auVar43._4_4_ = referenceValue.m_data[1];
    auVar43._0_4_ = referenceValue.m_data[0];
    auVar43._8_4_ = referenceValue.m_data[2];
    auVar43._12_4_ = referenceValue.m_data[3];
    local_348.colorThreshold.m_data =
         (float  [4])
         divps(auVar43,*(undefined1 (*) [16])(samplerParams->super_RenderParams).colorScale.m_data);
    local_348.coordBits.m_data[0] = 0x14;
    local_348.coordBits.m_data[1] = 0x14;
    local_348.coordBits.m_data[2] = 0;
    local_348.uvwBits.m_data[0] = 5;
    local_348.uvwBits.m_data[1] = 5;
    local_348.uvwBits.m_data[2] = 0;
    local_348.colorMask.m_data[1] = 0 < iVar47;
    local_348.colorMask.m_data[0] = 0 < iVar37;
    local_348.colorMask.m_data[2] = 0 < iVar49;
    local_348.colorMask.m_data[3] = 0 < iVar35;
    if (local_500->m_samplingFunction == SAMPLE_FILTER) {
      referenceValue.m_data[0] = 1.12104e-44;
      referenceValue.m_data[1] = 4.2039e-45;
      pvVar38 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar38 != (void *)0x0) {
        pvVar38 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_308,(TextureFormat *)&referenceValue,renderedFrame->m_width,
                 renderedFrame->m_height,1,pvVar38);
      pfVar18 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar24 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      reference.m_width = (pRVar24->m_pixelFormat).redBits;
      reference.m_height = (pRVar24->m_pixelFormat).greenBits;
      reference.m_pixels.m_ptr = *(void **)&(pRVar24->m_pixelFormat).blueBits;
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage_2,local_308.m_size.m_data[0],local_308.m_size.m_data[1]
                );
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage,local_308.m_size.m_data[0],local_308.m_size.m_data[1]);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&referenceValue,(Surface *)&srcLevelStorage_2,
                 (PixelFormat *)&reference);
      pTVar6 = (pTVar36->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      resultValue.m_data._8_8_ = (pTVar6->m_refTexture).m_view.m_levels;
      resultValue.m_data[0] = (float)(pTVar6->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&referenceValue,(Texture2DView *)&resultValue,pfVar18,
                 samplerParams);
      resultValue.m_data[0] = 1.12104e-44;
      resultValue.m_data[1] = 4.2039e-45;
      pCVar39 = (pointer)CONCAT26(srcLevelStorage_2.
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                  srcLevelStorage_2.
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_);
      if ((pointer)CONCAT26(srcLevelStorage_2.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                            srcLevelStorage_2.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) !=
          (pointer)0x0) {
        pCVar39 = srcLevelStorage_2.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&referenceValue,(TextureFormat *)&resultValue,
                 (int)srcLevelStorage_2.
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                 srcLevelStorage_2.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_,1,pCVar39);
      resultValue_1.m_data[0] = 1.12104e-44;
      resultValue_1.m_data[1] = 4.2039e-45;
      pCVar39 = srcLevelStorage.
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        pCVar39 = srcLevelStorage.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&resultValue,(TextureFormat *)&resultValue_1,
                 (int)srcLevelStorage.
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                 srcLevelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_,1,pCVar39);
      pTVar6 = (pTVar36->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      resultValue_1.m_data[0] = (float)(pTVar6->m_refTexture).m_view.m_numLevels;
      resultValue_1.m_data._8_8_ = (pTVar6->m_refTexture).m_view.m_levels;
      iVar37 = glu::TextureTestUtil::computeTextureLookupDiff
                         (&local_308,(ConstPixelBufferAccess *)&referenceValue,
                          (PixelBufferAccess *)&resultValue,(Texture2DView *)&resultValue_1,pfVar18,
                          samplerParams,&local_348,&lodPrecision,
                          ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      if (0 < iVar37) {
        pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar7,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar3,iVar37);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_230);
      }
      pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_4c8._M_allocated_capacity = 0x6552796669726556;
      resultValue_1.m_data[2] = 1.68156e-44;
      resultValue_1.m_data[3] = 0.0;
      resultValue_1.m_data._0_8_ = &local_4c8;
      local_4c8._8_5_ = 0x746c7573;
      res.m_data = (float  [2])&local_510;
      referenceValue.m_data[0] = 2.66247e-44;
      referenceValue.m_data[1] = 0.0;
      res.m_data = (float  [2])std::__cxx11::string::_M_create((ulong *)&res,(ulong)&referenceValue)
      ;
      local_510._M_allocated_capacity = CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]);
      *(undefined8 *)res.m_data = 0x6163696669726556;
      builtin_strncpy((char *)((long)res.m_data + 8),"tion res",8);
      builtin_strncpy((char *)((long)res.m_data + 0xf),"sult",4);
      *(char *)((long)res.m_data + local_510._M_allocated_capacity) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultValue,(string *)&resultValue_1,(string *)&res);
      tcu::TestLog::startImageSet(pTVar7,(char *)resultValue.m_data._0_8_,local_3b8._M_p);
      paVar2 = &local_4f8.field_2;
      local_4f8.field_2._M_allocated_capacity = 0x64657265646e6552;
      local_4f8._M_string_length = 8;
      local_4f8.field_2._8_2_ = (ushort)(byte)local_4f8.field_2._M_local_buf[9] << 8;
      paVar4 = &local_480.field_2;
      local_480.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_480.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_480.field_2._M_local_buf[8] = ' ';
      local_480.field_2._M_local_buf[9] = 'i';
      local_480.field_2._10_4_ = 0x6567616d;
      local_480._M_string_length = 0xe;
      local_480.field_2._M_local_buf[0xe] = '\0';
      pCVar31 = &local_308;
      local_4f8._M_dataplus._M_p = (pointer)paVar2;
      local_480._M_dataplus._M_p = (pointer)paVar4;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,&local_4f8,&local_480,pCVar31,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,(int)pTVar7,__buf,(size_t)pCVar31);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != local_278) {
        operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                        local_298._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar4) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                 local_480.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue.m_data._0_8_ != &local_3c8) {
        operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
      }
      if (res.m_data != (float  [2])&local_510) {
        operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue_1.m_data._0_8_ != &local_4c8) {
        operator_delete((void *)resultValue_1.m_data._0_8_,local_4c8._M_allocated_capacity + 1);
      }
      if (0 < iVar37) {
        pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_4c8._M_allocated_capacity = 0x636e657265666552;
        local_4c8._8_2_ = 0x65;
        resultValue_1.m_data[2] = 1.26117e-44;
        resultValue_1.m_data[3] = 0.0;
        resultValue_1.m_data._0_8_ = &local_4c8;
        res.m_data = (float  [2])&local_510;
        resultValue.m_data[0] = 2.94273e-44;
        resultValue.m_data[1] = 0.0;
        res.m_data = (float  [2])std::__cxx11::string::_M_create((ulong *)&res,(ulong)&resultValue);
        local_510._M_allocated_capacity._0_4_ = resultValue.m_data[0];
        local_510._M_allocated_capacity._4_4_ = resultValue.m_data[1];
        *(undefined8 *)res.m_data = 0x6572206c61656449;
        builtin_strncpy((char *)((long)res.m_data + 8),"ference ",8);
        builtin_strncpy((char *)((long)res.m_data + 0xd),"ce image",8);
        *(char *)((long)res.m_data + resultValue.m_data._0_8_) = '\0';
        pSVar32 = (Surface *)&srcLevelStorage_2;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&resultValue_1,(string *)&res,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar47 = (int)pTVar7;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar47,__buf_00,(size_t)pSVar32);
        local_4f8.field_2._M_allocated_capacity = 0x73614d726f727245;
        local_4f8.field_2._8_2_ = 0x6b;
        local_4f8._M_string_length = 9;
        local_480.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
        local_480.field_2._M_allocated_capacity._6_2_ = 0x616d;
        local_480.field_2._M_local_buf[8] = 's';
        local_480.field_2._M_local_buf[9] = 'k';
        local_480._M_string_length = 10;
        local_480.field_2._10_4_ = local_480.field_2._10_4_ & 0xffffff00;
        pSVar32 = (Surface *)&srcLevelStorage;
        local_4f8._M_dataplus._M_p = (pointer)paVar2;
        local_480._M_dataplus._M_p = (pointer)paVar4;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,&local_4f8,&local_480,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar47,__buf_01,(size_t)pSVar32);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resultValue.m_data._0_8_ != &local_3c8) {
          operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != paVar4) {
          operator_delete(local_480._M_dataplus._M_p,
                          CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                   local_480.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_p != local_278) {
          operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                          local_298._M_allocated_capacity + 1);
        }
        if (res.m_data != (float  [2])&local_510) {
          operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resultValue_1.m_data._0_8_ != &local_4c8) {
          operator_delete((void *)resultValue_1.m_data._0_8_,local_4c8._M_allocated_capacity + 1);
        }
      }
      pTVar36 = local_500;
      tcu::TestLog::endImageSet
                (((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface((Surface *)&srcLevelStorage);
      tcu::Surface::~Surface((Surface *)&srcLevelStorage_2);
      goto LAB_014e9634;
    }
    if (local_500->m_samplingFunction != SAMPLE_GATHER) goto LAB_014ea0da;
    referenceValue.m_data[0] = 1.12104e-44;
    referenceValue.m_data[1] = 4.2039e-45;
    pvVar38 = (void *)(renderedFrame->m_pixels).m_cap;
    if (pvVar38 != (void *)0x0) {
      pvVar38 = (renderedFrame->m_pixels).m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_308,(TextureFormat *)&referenceValue,renderedFrame->m_width,
               renderedFrame->m_height,1,pvVar38);
    local_118 = (float)*(undefined8 *)
                        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
    fStack_114 = (float)((ulong)*(undefined8 *)
                                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 0x20);
    fStack_110 = 0.0;
    fStack_10c = 0.0;
    local_2c8 = *(undefined8 *)
                 (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 2);
    uStack_2c0 = 0;
    local_2d8 = *(undefined8 *)
                 (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4);
    uStack_2d0 = 0;
    local_128 = *(undefined8 *)
                 (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 6);
    uStack_120 = 0;
    pRVar24 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
    iVar47 = (pRVar24->m_pixelFormat).redBits;
    iVar49 = (pRVar24->m_pixelFormat).greenBits;
    iVar35 = (pRVar24->m_pixelFormat).blueBits;
    iVar50 = (pRVar24->m_pixelFormat).alphaBits;
    srcLevelStorage_2.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    srcLevelStorage_2.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    srcLevelStorage_2.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0;
    srcLevelStorage_2.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
    pTVar6 = (pTVar36->m_texture).
             super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
    referenceValue.m_data[0] = (float)(pTVar6->m_refTexture).m_view.m_numLevels;
    pCVar31 = (pTVar6->m_refTexture).m_view.m_levels;
    referenceValue.m_data[2] = SUB84(pCVar31,0);
    referenceValue.m_data[3] = (float)((ulong)pCVar31 >> 0x20);
    pSVar1 = &samplerParams->sampler;
    TVar60 = tcu::getEffectiveTextureView
                       ((Texture2DView *)&referenceValue,&srcLevelStorage_2,pSVar1);
    errorMask.m_pixels.m_ptr = TVar60.m_levels;
    errorMask.m_width = TVar60.m_numLevels;
    tcu::Surface::Surface
              ((Surface *)&srcLevelStorage,local_308.m_size.m_data[0],local_308.m_size.m_data[1]);
    tcu::Surface::Surface(&reference,local_308.m_size.m_data[0],local_308.m_size.m_data[1]);
    resultValue.m_data[0] = 1.12104e-44;
    resultValue.m_data[1] = 4.2039e-45;
    if (reference.m_pixels.m_cap != 0) {
      reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&referenceValue,(TextureFormat *)&resultValue,reference.m_width,
               reference.m_height,1,(void *)reference.m_pixels.m_cap);
    resultValue_1.m_data[0] = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)&resultValue_1);
    tcu::clear((PixelBufferAccess *)&referenceValue,&resultValue);
    if (srcLevelStorage.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ < 1) {
      iVar37 = 0;
LAB_014e9c1e:
      bVar20 = false;
      pTVar36 = local_500;
    }
    else {
      fVar54 = (float)local_2c8 - (float)local_128;
      fVar55 = local_2c8._4_4_ - local_128._4_4_;
      fVar56 = (float)local_2d8 - (float)local_128;
      fVar58 = local_2d8._4_4_ - local_128._4_4_;
      local_2d8 = CONCAT44(local_2d8._4_4_ - fStack_114,(float)local_2d8 - local_118);
      uStack_2d0 = CONCAT44(uStack_2d0._4_4_ - fStack_10c,(float)uStack_2d0 - fStack_110);
      local_2c8 = CONCAT44(local_2c8._4_4_ - fStack_114,(float)local_2c8 - local_118);
      uStack_2c0 = CONCAT44(uStack_2c0._4_4_ - fStack_10c,(float)uStack_2c0 - fStack_110);
      z = 0;
      iVar37 = 0;
      iVar23 = (int)srcLevelStorage.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      iVar40 = srcLevelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_;
      do {
        if (0 < iVar23) {
          iVar40 = 0;
          do {
            auVar44._0_4_ = (float)iVar40 + 0.5;
            auVar44._4_4_ = (float)z + 0.5;
            auVar44._8_8_ = 0;
            auVar53._0_4_ = (float)iVar23;
            auVar53._4_4_ =
                 (float)srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_;
            auVar53._8_8_ = 0;
            auVar43 = divps(auVar44,auVar53);
            fVar59 = auVar43._0_4_;
            fVar48 = auVar43._4_4_;
            if (1.0 <= fVar59 + fVar48) {
              fVar57 = (1.0 - fVar48) * fVar56 + (1.0 - fVar59) * fVar54 + (float)local_128;
              fVar59 = (1.0 - fVar48) * fVar58 + (1.0 - fVar59) * fVar55 + local_128._4_4_;
            }
            else {
              fVar57 = fVar48 * (float)local_2c8 + fVar59 * (float)local_2d8 + local_118;
              fVar59 = fVar48 * local_2c8._4_4_ + fVar59 * local_2d8._4_4_ + fStack_114;
            }
            res.m_data[1] = fVar59;
            res.m_data[0] = fVar57;
            paIVar25 = glu::getDefaultGatherOffsets();
            tcu::gatherArray2DOffsets
                      ((tcu *)&referenceValue,(ConstPixelBufferAccess *)errorMask.m_pixels.m_ptr,
                       pSVar1,fVar57,fVar59,0,0,paIVar25);
            uVar16 = *(undefined8 *)(samplerParams->super_RenderParams).colorBias.m_data;
            uVar17 = *(undefined8 *)((samplerParams->super_RenderParams).colorBias.m_data + 2);
            fVar59 = (samplerParams->super_RenderParams).colorScale.m_data[0] *
                     referenceValue.m_data[0];
            fVar48 = (samplerParams->super_RenderParams).colorScale.m_data[1] *
                     referenceValue.m_data[1];
            fVar57 = (samplerParams->super_RenderParams).colorScale.m_data[2] *
                     referenceValue.m_data[2];
            fVar51 = (samplerParams->super_RenderParams).colorScale.m_data[3] *
                     referenceValue.m_data[3];
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultValue,(int)&local_308,iVar40,z);
            uVar34 = 0;
            auVar45._0_4_ =
                 resultValue.m_data[0] - (samplerParams->super_RenderParams).colorBias.m_data[0];
            auVar45._4_4_ =
                 resultValue.m_data[1] - (samplerParams->super_RenderParams).colorBias.m_data[1];
            auVar45._8_4_ =
                 resultValue.m_data[2] - (samplerParams->super_RenderParams).colorBias.m_data[2];
            auVar45._12_4_ =
                 resultValue.m_data[3] - (samplerParams->super_RenderParams).colorBias.m_data[3];
            resultValue_1.m_data =
                 (float  [4])
                 divps(auVar45,*(undefined1 (*) [16])
                                (samplerParams->super_RenderParams).colorScale.m_data);
            uVar21 = 0;
            if (iVar47 != 0) {
              uVar22 = 0x7e - ((int)referenceValue.m_data[0] >> 0x17);
              uVar21 = (((uint)referenceValue.m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >>
                       ((byte)uVar22 & 0x1f)) + 0x800000;
              if (8 < uVar22) {
                uVar21 = uVar22;
              }
              uVar21 = uVar21 >> 0x18;
            }
            if (iVar49 != 0) {
              uVar22 = 0x7e - ((int)referenceValue.m_data[1] >> 0x17);
              uVar34 = (((uint)referenceValue.m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >>
                       ((byte)uVar22 & 0x1f)) + 0x800000;
              if (8 < uVar22) {
                uVar34 = uVar22;
              }
              uVar34 = uVar34 >> 0x10 & 0xff00;
            }
            if (iVar35 == 0) {
              uVar22 = 0;
            }
            else {
              uVar28 = 0x7e - ((int)referenceValue.m_data[2] >> 0x17);
              uVar22 = (((uint)referenceValue.m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >>
                       ((byte)uVar28 & 0x1f)) + 0x800000;
              if (8 < uVar28) {
                uVar22 = uVar28;
              }
              uVar22 = uVar22 >> 8 & 0xff0000;
            }
            if (iVar50 == 0) {
              uVar28 = 0xff000000;
            }
            else {
              uVar29 = 0x7e - ((int)referenceValue.m_data[3] >> 0x17);
              uVar28 = (((uint)referenceValue.m_data[3] & 0x7fffff) * 0xff + 0x7f800000 >>
                       ((byte)uVar29 & 0x1f)) + 0x800000;
              if (8 < uVar29) {
                uVar28 = uVar29;
              }
              uVar28 = uVar28 & 0xff000000;
            }
            local_98 = (float)uVar16;
            fStack_94 = (float)((ulong)uVar16 >> 0x20);
            fStack_90 = (float)uVar17;
            fStack_8c = (float)((ulong)uVar17 >> 0x20);
            fVar59 = fVar59 + local_98;
            fVar48 = fVar48 + fStack_94;
            fVar57 = fVar57 + fStack_90;
            fVar51 = fVar51 + fStack_8c;
            ((srcLevelStorage.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_finish)->m_size).m_data
            [(long)((int)srcLevelStorage.
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start * z + iVar40) + -2] =
                 uVar34 | uVar21 | uVar22 | uVar28;
            auVar46._4_4_ =
                 -(uint)(local_348.colorThreshold.m_data[1] <
                        (float)(~-(uint)(fVar48 < resultValue.m_data[1]) &
                                (uint)(fVar48 - resultValue.m_data[1]) |
                               (uint)(resultValue.m_data[1] - fVar48) &
                               -(uint)(fVar48 < resultValue.m_data[1])));
            auVar46._0_4_ =
                 -(uint)(local_348.colorThreshold.m_data[0] <
                        (float)(~-(uint)(fVar59 < resultValue.m_data[0]) &
                                (uint)(fVar59 - resultValue.m_data[0]) |
                               (uint)(resultValue.m_data[0] - fVar59) &
                               -(uint)(fVar59 < resultValue.m_data[0])));
            auVar46._8_4_ =
                 -(uint)(local_348.colorThreshold.m_data[2] <
                        (float)(~-(uint)(fVar57 < resultValue.m_data[2]) &
                                (uint)(fVar57 - resultValue.m_data[2]) |
                               (uint)(resultValue.m_data[2] - fVar57) &
                               -(uint)(fVar57 < resultValue.m_data[2])));
            auVar46._12_4_ =
                 -(uint)(local_348.colorThreshold.m_data[3] <
                        (float)(~-(uint)(fVar51 < resultValue.m_data[3]) &
                                (uint)(fVar51 - resultValue.m_data[3]) |
                               (uint)(resultValue.m_data[3] - fVar51) &
                               -(uint)(fVar51 < resultValue.m_data[3])));
            auVar43 = packssdw(auVar46,auVar46);
            auVar43 = packsswb(auVar43,auVar43);
            uVar21 = (uint)local_348.colorMask.m_data & auVar43._0_4_ & (uint)DAT_01b805f0;
            if (((((char)uVar21 != '\0') || ((uVar21 >> 8 & 1) != 0)) || ((uVar21 >> 0x10 & 1) != 0)
                ) || ((uVar21 >> 0x18 & 1) != 0)) {
              paIVar25 = glu::getDefaultGatherOffsets();
              bVar20 = tcu::isGatherOffsetsResultValid
                                 ((Texture2DView *)&errorMask,pSVar1,&local_348,&res,0,paIVar25,
                                  &resultValue_1);
              if (!bVar20) {
                *(undefined4 *)
                 ((long)reference.m_pixels.m_ptr + (long)(reference.m_width * z + iVar40) * 4) =
                     0xff0000ff;
                iVar37 = iVar37 + 1;
              }
            }
            iVar40 = iVar40 + 1;
            iVar23 = (int)srcLevelStorage.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          } while (iVar40 < (int)srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          iVar40 = srcLevelStorage.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
        }
        pTVar36 = local_500;
        z = z + 1;
      } while (z < iVar40);
      if (iVar37 < 1) goto LAB_014e9c1e;
      pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(referenceValue.m_data + 2);
      referenceValue.m_data[0] = SUB84(pTVar7,0);
      referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"ERROR: Result verification failed, got ",0x27);
      std::ostream::operator<<(poVar3,iVar37);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," invalid pixels!",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_230);
      iVar37 = 1;
      bVar20 = true;
    }
    pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_4c8._M_allocated_capacity = 0x6552796669726556;
    resultValue_1.m_data[2] = 1.68156e-44;
    resultValue_1.m_data[3] = 0.0;
    resultValue_1.m_data._0_8_ = &local_4c8;
    local_4c8._8_5_ = 0x746c7573;
    res.m_data = (float  [2])&local_510;
    referenceValue.m_data[0] = 2.66247e-44;
    referenceValue.m_data[1] = 0.0;
    res.m_data = (float  [2])std::__cxx11::string::_M_create((ulong *)&res,(ulong)&referenceValue);
    local_510._M_allocated_capacity = CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]);
    *(undefined8 *)res.m_data = 0x6163696669726556;
    builtin_strncpy((char *)((long)res.m_data + 8),"tion res",8);
    builtin_strncpy((char *)((long)res.m_data + 0xf),"sult",4);
    *(char *)((long)res.m_data + local_510._M_allocated_capacity) = '\0';
    tcu::LogImageSet::LogImageSet
              ((LogImageSet *)&resultValue,(string *)&resultValue_1,(string *)&res);
    tcu::TestLog::startImageSet(pTVar7,(char *)resultValue.m_data._0_8_,local_3b8._M_p);
    paVar2 = &local_4f8.field_2;
    local_4f8.field_2._M_allocated_capacity = 0x64657265646e6552;
    local_4f8._M_string_length = 8;
    local_4f8.field_2._8_2_ = (ushort)(byte)local_4f8.field_2._M_local_buf[9] << 8;
    paVar4 = &local_480.field_2;
    local_480.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_480.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_480.field_2._M_local_buf[8] = ' ';
    local_480.field_2._M_local_buf[9] = 'i';
    local_480.field_2._10_4_ = 0x6567616d;
    local_480._M_string_length = 0xe;
    local_480.field_2._M_local_buf[0xe] = '\0';
    pCVar31 = &local_308;
    local_4f8._M_dataplus._M_p = (pointer)paVar2;
    local_480._M_dataplus._M_p = (pointer)paVar4;
    tcu::LogImage::LogImage
              ((LogImage *)&referenceValue,&local_4f8,&local_480,pCVar31,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&referenceValue,(int)pTVar7,__buf_08,(size_t)pCVar31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != local_278) {
      operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                      local_298._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != paVar4) {
      operator_delete(local_480._M_dataplus._M_p,
                      CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                               local_480.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_p != local_3a8) {
      operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultValue.m_data._0_8_ != &local_3c8) {
      operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
    }
    if (res.m_data != (float  [2])&local_510) {
      operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultValue_1.m_data._0_8_ != &local_4c8) {
      operator_delete((void *)resultValue_1.m_data._0_8_,local_4c8._M_allocated_capacity + 1);
    }
    if (bVar20) {
      pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_4c8._M_allocated_capacity = 0x636e657265666552;
      local_4c8._8_2_ = 0x65;
      resultValue_1.m_data[2] = 1.26117e-44;
      resultValue_1.m_data[3] = 0.0;
      resultValue_1.m_data._0_8_ = &local_4c8;
      res.m_data = (float  [2])&local_510;
      resultValue.m_data[0] = 2.94273e-44;
      resultValue.m_data[1] = 0.0;
      res.m_data = (float  [2])std::__cxx11::string::_M_create((ulong *)&res,(ulong)&resultValue);
      local_510._M_allocated_capacity._0_4_ = resultValue.m_data[0];
      local_510._M_allocated_capacity._4_4_ = resultValue.m_data[1];
      *(undefined8 *)res.m_data = 0x6572206c61656449;
      builtin_strncpy((char *)((long)res.m_data + 8),"ference ",8);
      builtin_strncpy((char *)((long)res.m_data + 0xd),"ce image",8);
      *(char *)((long)res.m_data + resultValue.m_data._0_8_) = '\0';
      pSVar32 = (Surface *)&srcLevelStorage;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,(string *)&resultValue_1,(string *)&res,pSVar32,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar47 = (int)pTVar7;
      tcu::LogImage::write((LogImage *)&referenceValue,iVar47,__buf_09,(size_t)pSVar32);
      local_4f8.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_4f8.field_2._8_2_ = 0x6b;
      local_4f8._M_string_length = 9;
      local_480.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_480.field_2._M_allocated_capacity._6_2_ = 0x616d;
      local_480.field_2._M_local_buf[8] = 's';
      local_480.field_2._M_local_buf[9] = 'k';
      local_480._M_string_length = 10;
      local_480.field_2._10_4_ = local_480.field_2._10_4_ & 0xffffff00;
      pSVar32 = &reference;
      local_4f8._M_dataplus._M_p = (pointer)paVar2;
      local_480._M_dataplus._M_p = (pointer)paVar4;
      tcu::LogImage::LogImage
                ((LogImage *)&resultValue,&local_4f8,&local_480,pSVar32,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&resultValue,iVar47,__buf_10,(size_t)pSVar32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue.m_data._0_8_ != &local_3c8) {
        operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar4) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                 local_480.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != local_278) {
        operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                        local_298._M_allocated_capacity + 1);
      }
      if (res.m_data != (float  [2])&local_510) {
        operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue_1.m_data._0_8_ != &local_4c8) {
        operator_delete((void *)resultValue_1.m_data._0_8_,local_4c8._M_allocated_capacity + 1);
      }
    }
    pTVar36 = local_500;
    tcu::TestLog::endImageSet
              (((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    tcu::Surface::~Surface(&reference);
    tcu::Surface::~Surface((Surface *)&srcLevelStorage);
    if (srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(srcLevelStorage_2.
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT26(srcLevelStorage_2.
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                               srcLevelStorage_2.
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) -
                      (long)srcLevelStorage_2.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
joined_r0x014ea0d8:
    if (iVar37 == 0) goto LAB_014ea135;
  }
  else {
    local_88.derivateBits = 0x12;
    local_88.rule = lodPrecision.rule;
    local_308.m_format.order = DS;
    local_308.m_format.type = SIGNED_INT_1010102_REV;
    local_308.m_size.m_data[0] = 0;
    local_308.m_size.m_data[1] = 7;
    local_308.m_size.m_data[2] = 7;
    local_308.m_pitch.m_data[0] = 0;
    local_308.m_pitch.m_data[1] = 5;
    local_308.m_pitch.m_data[2] = 0x10;
    local_4b8 = 0;
    if (0 < iVar37 + -1) {
      local_4b8 = iVar37 + -1;
    }
    resultValue_1.m_data[2] = 0.0;
    resultValue_1.m_data[3] = 5.60519e-45;
    resultValue_1.m_data[0] = 2.8026e-44;
    resultValue_1.m_data[1] = 2.8026e-44;
    local_4c8._M_allocated_capacity = 4;
    local_4c8._8_4_ = 0;
    local_4c8._12_4_ = 0x10;
    local_88.lodBits = 4;
    local_308.m_data._0_4_ = local_4b8;
    if (local_500->m_samplingFunction == SAMPLE_FILTER) {
      referenceValue.m_data[0] = 1.12104e-44;
      referenceValue.m_data[1] = 4.2039e-45;
      pvVar38 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar38 != (void *)0x0) {
        pvVar38 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&local_348,(TextureFormat *)&referenceValue,
                 renderedFrame->m_width,renderedFrame->m_height,1,pvVar38);
      pfVar18 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar24 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      effectiveView.m_numLevels = (pRVar24->m_pixelFormat).redBits;
      effectiveView._4_4_ = (pRVar24->m_pixelFormat).greenBits;
      pCVar31 = *(ConstPixelBufferAccess **)&(pRVar24->m_pixelFormat).blueBits;
      effectiveView.m_levels._0_4_ = (int)pCVar31;
      effectiveView.m_levels._4_4_ = (int)((ulong)pCVar31 >> 0x20);
      nonShadowBits.m_data[0] =
           -(uint)(0 < (int)(effectiveView.m_numLevels - 1U)) & effectiveView.m_numLevels - 1U;
      nonShadowBits.m_data[1] =
           -(uint)(0 < (int)(effectiveView._4_4_ - 1)) & effectiveView._4_4_ - 1;
      nonShadowBits.m_data[2] =
           -(uint)(0 < (int)((int)effectiveView.m_levels - 1U)) & (int)effectiveView.m_levels - 1U;
      nonShadowBits.m_data[3] =
           -(uint)(0 < (int)(effectiveView.m_levels._4_4_ - 1U)) & effectiveView.m_levels._4_4_ - 1U
      ;
      effectiveView.m_levels = pCVar31;
      tcu::computeFixedPointThreshold((tcu *)&referenceValue,&nonShadowBits);
      local_78.m_data[1] = referenceValue.m_data[2];
      local_78.m_data[0] = referenceValue.m_data[1];
      local_78.m_data[2] = referenceValue.m_data[3];
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar6 = (pTVar36->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      referenceValue.m_data[0] = (float)(pTVar6->m_refTexture).m_view.m_numLevels;
      pCVar31 = (pTVar6->m_refTexture).m_view.m_levels;
      referenceValue.m_data[2] = SUB84(pCVar31,0);
      referenceValue.m_data[3] = (float)((ulong)pCVar31 >> 0x20);
      TVar60 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&referenceValue,&srcLevelStorage,&samplerParams->sampler)
      ;
      effectiveView_1.m_levels = TVar60.m_levels;
      effectiveView_1.m_numLevels = TVar60.m_numLevels;
      tcu::Surface::Surface(&reference,local_348.coordBits.m_data[2],local_348.uvwBits.m_data[0]);
      tcu::Surface::Surface(&errorMask,local_348.coordBits.m_data[2],local_348.uvwBits.m_data[0]);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&referenceValue,&reference,(PixelFormat *)&effectiveView);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&referenceValue,&effectiveView_1,pfVar18,samplerParams);
      resultValue.m_data[0] = 1.12104e-44;
      resultValue.m_data[1] = 4.2039e-45;
      pvVar38 = (void *)reference.m_pixels.m_cap;
      if (reference.m_pixels.m_cap != 0) {
        pvVar38 = reference.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&referenceValue,(TextureFormat *)&resultValue,
                 reference.m_width,reference.m_height,1,pvVar38);
      res.m_data[0] = 1.12104e-44;
      res.m_data[1] = 4.2039e-45;
      pvVar38 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar38 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&resultValue,(TextureFormat *)&res,errorMask.m_width,
                 errorMask.m_height,1,pvVar38);
      iVar37 = glu::TextureTestUtil::computeTextureCompareDiff
                         ((ConstPixelBufferAccess *)&local_348,
                          (ConstPixelBufferAccess *)&referenceValue,
                          (PixelBufferAccess *)&resultValue,&effectiveView_1,pfVar18,samplerParams,
                          (TexComparePrecision *)&local_308,&lodPrecision,&local_78);
      if (iVar37 < 1) {
LAB_014e9175:
        bVar20 = false;
      }
      else {
        pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar7,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,
                   "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_230);
        resultValue.m_data[0] = 1.12104e-44;
        resultValue.m_data[1] = 4.2039e-45;
        if (reference.m_pixels.m_cap != 0) {
          reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&referenceValue,(TextureFormat *)&resultValue,
                   reference.m_width,reference.m_height,1,(void *)reference.m_pixels.m_cap);
        pTVar36 = local_500;
        res.m_data[0] = 1.12104e-44;
        res.m_data[1] = 4.2039e-45;
        if (errorMask.m_pixels.m_cap != 0) {
          errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&resultValue,(TextureFormat *)&res,errorMask.m_width,
                   errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
        iVar37 = glu::TextureTestUtil::computeTextureCompareDiff
                           ((ConstPixelBufferAccess *)&local_348,
                            (ConstPixelBufferAccess *)&referenceValue,
                            (PixelBufferAccess *)&resultValue,&effectiveView_1,pfVar18,samplerParams
                            ,(TexComparePrecision *)&resultValue_1,&local_88,&local_78);
        if (iVar37 < 1) {
          if (((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
              QP_TEST_RESULT_PASS) {
            referenceValue.m_data._0_8_ = &local_298;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&referenceValue,"Low-quality result","");
            tcu::ResultCollector::addResult
                      (&pTVar36->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&referenceValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)referenceValue.m_data._0_8_ != &local_298) {
              operator_delete((void *)referenceValue.m_data._0_8_,
                              local_298._M_allocated_capacity + 1);
            }
          }
          goto LAB_014e9175;
        }
        pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar3 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar7,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_230);
        pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        referenceValue.m_data[0] = SUB84(pTVar7,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
        poVar3 = (ostringstream *)(referenceValue.m_data + 2);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar3,iVar37);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_230);
        iVar37 = 1;
        bVar20 = true;
      }
      pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      res.m_data = (float  [2])&local_510;
      local_510._M_allocated_capacity = 0x6552796669726556;
      local_510._8_4_ = 0x746c7573;
      local_510._M_local_buf[0xc] = '\0';
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      referenceValue.m_data[0] = 2.66247e-44;
      referenceValue.m_data[1] = 0.0;
      local_4f8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&referenceValue);
      local_4f8._M_string_length = CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]);
      *(undefined8 *)local_4f8._M_dataplus._M_p = 0x6163696669726556;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 8) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 9) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xc) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x11) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x12) = 't';
      local_4f8._M_dataplus._M_p[local_4f8._M_string_length] = '\0';
      local_4f8.field_2._M_allocated_capacity = local_4f8._M_string_length;
      tcu::LogImageSet::LogImageSet((LogImageSet *)&resultValue,(string *)&res,&local_4f8);
      tcu::TestLog::startImageSet(pTVar7,(char *)resultValue.m_data._0_8_,local_3b8._M_p);
      paVar2 = &local_480.field_2;
      local_480.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_480.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_480._M_string_length = 8;
      local_480.field_2._M_local_buf[8] = '\0';
      ppCVar5 = &srcLevelStorage_2.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x7265646e6552;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x6465;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0xe;
      pLVar33 = &local_348;
      local_480._M_dataplus._M_p = (pointer)paVar2;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar5;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,&local_480,(string *)&srcLevelStorage_2,
                 (ConstPixelBufferAccess *)pLVar33,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,(int)pTVar7,__buf_02,(size_t)pLVar33);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != local_278) {
        operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                        local_298._M_allocated_capacity + 1);
      }
      if (srcLevelStorage_2.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar5) {
        operator_delete(srcLevelStorage_2.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT26(srcLevelStorage_2.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                 srcLevelStorage_2.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar2) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                 local_480.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue.m_data._0_8_ != &local_3c8) {
        operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if (res.m_data != (float  [2])&local_510) {
        operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
      }
      if (bVar20) {
        pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        res.m_data = (float  [2])&local_510;
        local_510._M_allocated_capacity = 0x636e657265666552;
        local_510._8_2_ = 0x65;
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        resultValue.m_data[0] = 2.94273e-44;
        resultValue.m_data[1] = 0.0;
        local_4f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&resultValue);
        local_4f8.field_2._M_allocated_capacity._0_4_ = resultValue.m_data[0];
        local_4f8.field_2._M_allocated_capacity._4_4_ = resultValue.m_data[1];
        *(undefined8 *)local_4f8._M_dataplus._M_p = 0x6572206c61656449;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 8) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xd) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xd) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x11) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x12) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x13) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x14) = 'e';
        local_4f8._M_string_length._0_4_ = resultValue.m_data[0];
        local_4f8._M_string_length._4_4_ = resultValue.m_data[1];
        local_4f8._M_dataplus._M_p[resultValue.m_data._0_8_] = '\0';
        pSVar32 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&res,&local_4f8,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar47 = (int)pTVar7;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar47,__buf_03,(size_t)pSVar32);
        local_480.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_480.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_480.field_2._M_local_buf[8] = 'k';
        local_480.field_2._M_local_buf[9] = '\0';
        local_480._M_string_length = 9;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x20726f727245;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x616d;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xa;
        pSVar32 = &errorMask;
        local_480._M_dataplus._M_p = (pointer)paVar2;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar5;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,&local_480,(string *)&srcLevelStorage_2,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar47,__buf_04,(size_t)pSVar32);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resultValue.m_data._0_8_ != &local_3c8) {
          operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
        }
        if (srcLevelStorage_2.
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar5) {
          operator_delete(srcLevelStorage_2.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT26(srcLevelStorage_2.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                   srcLevelStorage_2.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != paVar2) {
          operator_delete(local_480._M_dataplus._M_p,
                          CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                   local_480.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_p != local_278) {
          operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                          local_298._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if (res.m_data != (float  [2])&local_510) {
          operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
        }
      }
      pTVar36 = local_500;
      tcu::TestLog::endImageSet
                (((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&reference);
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
LAB_014e9634:
      goto joined_r0x014ea0d8;
    }
    if (local_500->m_samplingFunction == SAMPLE_GATHER) {
      referenceValue.m_data[0] = 1.12104e-44;
      referenceValue.m_data[1] = 4.2039e-45;
      pvVar38 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar38 != (void *)0x0) {
        pvVar38 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&local_348,(TextureFormat *)&referenceValue,
                 renderedFrame->m_width,renderedFrame->m_height,1,pvVar38);
      local_118 = (float)*(undefined8 *)
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
      fStack_114 = (float)((ulong)*(undefined8 *)
                                   texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 0x20);
      fStack_110 = 0.0;
      fStack_10c = 0.0;
      local_2c8 = *(undefined8 *)
                   (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2);
      uStack_2c0 = 0;
      local_2d8 = *(undefined8 *)
                   (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 4);
      uStack_2d0 = 0;
      local_128 = *(undefined8 *)
                   (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 6);
      uStack_120 = 0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar6 = (pTVar36->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      referenceValue.m_data[0] = (float)(pTVar6->m_refTexture).m_view.m_numLevels;
      pCVar31 = (pTVar6->m_refTexture).m_view.m_levels;
      referenceValue.m_data[2] = SUB84(pCVar31,0);
      referenceValue.m_data[3] = (float)((ulong)pCVar31 >> 0x20);
      pSVar1 = &samplerParams->sampler;
      TVar60 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&referenceValue,&srcLevelStorage,pSVar1);
      effectiveView.m_levels = TVar60.m_levels;
      effectiveView.m_numLevels = TVar60.m_numLevels;
      pRVar24 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      uVar12 = (pRVar24->m_pixelFormat).redBits;
      uVar13 = (pRVar24->m_pixelFormat).greenBits;
      uVar14 = (pRVar24->m_pixelFormat).blueBits;
      uVar15 = (pRVar24->m_pixelFormat).alphaBits;
      tcu::Surface::Surface(&reference,local_348.coordBits.m_data[2],local_348.uvwBits.m_data[0]);
      tcu::Surface::Surface(&errorMask,local_348.coordBits.m_data[2],local_348.uvwBits.m_data[0]);
      resultValue.m_data[0] = 1.12104e-44;
      resultValue.m_data[1] = 4.2039e-45;
      if (errorMask.m_pixels.m_cap != 0) {
        errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&referenceValue,(TextureFormat *)&resultValue,
                 errorMask.m_width,errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
      res.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&res);
      tcu::clear((PixelBufferAccess *)&referenceValue,&resultValue);
      if (reference.m_height < 1) {
        bVar20 = false;
        iVar37 = 0;
        pTVar36 = local_500;
      }
      else {
        auVar41._0_4_ = -(uint)(uVar12 == 0);
        auVar41._4_4_ = -(uint)(uVar13 == 0);
        auVar41._8_4_ = -(uint)(uVar14 == 0);
        auVar41._12_4_ = -(uint)(uVar15 == 0);
        uVar21 = movmskps(extraout_EAX,auVar41);
        fVar54 = (float)local_2c8 - (float)local_128;
        fVar55 = local_2c8._4_4_ - local_128._4_4_;
        fVar56 = (float)local_2d8 - (float)local_128;
        fVar58 = local_2d8._4_4_ - local_128._4_4_;
        local_2d8 = CONCAT44(local_2d8._4_4_ - fStack_114,(float)local_2d8 - local_118);
        uStack_2d0 = CONCAT44(uStack_2d0._4_4_ - fStack_10c,(float)uStack_2d0 - fStack_110);
        local_2c8 = CONCAT44(local_2c8._4_4_ - fStack_114,(float)local_2c8 - local_118);
        uStack_2c0 = CONCAT44(uStack_2c0._4_4_ - fStack_10c,(float)uStack_2c0 - fStack_110);
        bVar20 = false;
        iVar35 = 0;
        local_45c = 0;
        iVar47 = reference.m_width;
        iVar49 = reference.m_height;
        do {
          if (0 < iVar47) {
            iVar37 = 0;
            do {
              auVar42._0_4_ = (float)iVar37 + 0.5;
              auVar42._4_4_ = (float)iVar35 + 0.5;
              auVar42._8_8_ = 0;
              auVar52._0_4_ = (float)iVar47;
              auVar52._4_4_ = (float)reference.m_height;
              auVar52._8_8_ = 0;
              auVar43 = divps(auVar42,auVar52);
              fVar59 = auVar43._0_4_;
              fVar48 = auVar43._4_4_;
              if (1.0 <= fVar59 + fVar48) {
                fVar57 = (1.0 - fVar48) * fVar56 + (1.0 - fVar59) * fVar54 + (float)local_128;
                fVar59 = (1.0 - fVar48) * fVar58 + (1.0 - fVar59) * fVar55 + local_128._4_4_;
              }
              else {
                fVar57 = fVar48 * (float)local_2c8 + fVar59 * (float)local_2d8 + local_118;
                fVar59 = fVar48 * local_2c8._4_4_ + fVar59 * local_2d8._4_4_ + fStack_114;
              }
              res.m_data[1] = fVar59;
              res.m_data[0] = fVar57;
              fVar48 = (samplerParams->super_RenderParams).ref;
              paIVar25 = glu::getDefaultGatherOffsets();
              tcu::gatherArray2DOffsetsCompare
                        ((tcu *)&referenceValue,effectiveView.m_levels,pSVar1,fVar48,fVar57,fVar59,0
                         ,paIVar25);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultValue,(int)&local_348,iVar37,iVar35);
              uVar22 = 0;
              uVar34 = 0;
              if ((uVar21 & 1) == 0) {
                uVar28 = 0x7e - ((int)referenceValue.m_data[0] >> 0x17);
                uVar34 = (((uint)referenceValue.m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >>
                         ((byte)uVar28 & 0x1f)) + 0x800000;
                if (8 < uVar28) {
                  uVar34 = uVar28;
                }
                uVar34 = uVar34 >> 0x18;
              }
              if ((uVar21 & 2) == 0) {
                uVar28 = 0x7e - ((int)referenceValue.m_data[1] >> 0x17);
                uVar22 = (((uint)referenceValue.m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >>
                         ((byte)uVar28 & 0x1f)) + 0x800000;
                if (8 < uVar28) {
                  uVar22 = uVar28;
                }
                uVar22 = uVar22 >> 0x10 & 0xff00;
              }
              uVar28 = 0;
              if ((uVar21 & 4) == 0) {
                uVar29 = 0x7e - ((int)referenceValue.m_data[2] >> 0x17);
                uVar28 = (((uint)referenceValue.m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >>
                         ((byte)uVar29 & 0x1f)) + 0x800000;
                if (8 < uVar29) {
                  uVar28 = uVar29;
                }
                uVar28 = uVar28 >> 8 & 0xff0000;
              }
              uVar29 = 0xff000000;
              if ((byte)((byte)uVar21 >> 3) == 0) {
                uVar30 = 0x7e - ((int)referenceValue.m_data[3] >> 0x17);
                uVar29 = (((uint)referenceValue.m_data[3] & 0x7fffff) * 0xff + 0x7f800000 >>
                         ((byte)uVar30 & 0x1f)) + 0x800000;
                if (8 < uVar30) {
                  uVar29 = uVar30;
                }
                uVar29 = uVar29 & 0xff000000;
              }
              *(uint *)((long)reference.m_pixels.m_ptr +
                       (long)(reference.m_width * iVar35 + iVar37) * 4) =
                   uVar22 | uVar34 | uVar28 | uVar29;
              iVar47 = -(uint)(0 < (int)uVar13 && resultValue.m_data[1] != referenceValue.m_data[1])
              ;
              iVar49 = -(uint)(0 < (int)uVar14 && resultValue.m_data[2] != referenceValue.m_data[2])
              ;
              iVar50 = -(uint)(0 < (int)uVar15 && resultValue.m_data[3] != referenceValue.m_data[3])
              ;
              if ((int)uVar12 < 1 || resultValue.m_data[0] == referenceValue.m_data[0]) {
                uVar11 = -(short)(iVar47 >> 0x1f);
                bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar47 >> 0x1f) - (0xff < uVar11)
                ;
                uVar11 = -(short)(iVar49 >> 0x1f);
                bVar9 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar49 >> 0x1f) - (0xff < uVar11)
                ;
                uVar11 = -(short)(iVar50 >> 0x1f);
                bVar10 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar50 >> 0x1f) -
                         (0xff < uVar11);
                if (((((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8) & 1) != 0) ||
                    (((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9) & 1) != 0)) ||
                   (((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10) & 1) != 0))
                goto LAB_014e7c7c;
              }
              else {
LAB_014e7c7c:
                paIVar25 = glu::getDefaultGatherOffsets();
                bVar19 = tcu::isGatherOffsetsCompareResultValid
                                   (&effectiveView,pSVar1,(TexComparePrecision *)&local_308,&res,
                                    paIVar25,fVar48,&resultValue);
                if (!bVar19) {
                  paIVar25 = glu::getDefaultGatherOffsets();
                  bVar20 = tcu::isGatherOffsetsCompareResultValid
                                     (&effectiveView,pSVar1,(TexComparePrecision *)&resultValue_1,
                                      &res,paIVar25,fVar48,&resultValue);
                  if (bVar20) {
                    bVar20 = true;
                  }
                  else {
                    bVar20 = true;
                    *(undefined4 *)
                     ((long)errorMask.m_pixels.m_ptr +
                     (long)(errorMask.m_width * iVar35 + iVar37) * 4) = 0xff0000ff;
                    local_45c = local_45c + 1;
                  }
                }
              }
              iVar37 = iVar37 + 1;
              iVar47 = reference.m_width;
            } while (iVar37 < reference.m_width);
            iVar49 = reference.m_height;
          }
          iVar37 = local_45c;
          pTVar36 = local_500;
          iVar35 = iVar35 + 1;
        } while (iVar35 < iVar49);
        if (local_45c < 1) {
          if (bVar20) {
            pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar3 = (ostringstream *)(referenceValue.m_data + 2);
            referenceValue.m_data[0] = SUB84(pTVar7,0);
            referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,
                       "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&referenceValue,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar3);
            std::ios_base::~ios_base(local_230);
            resultValue.m_data[0] = 2.52234e-44;
            resultValue.m_data[1] = 0.0;
            referenceValue.m_data._0_8_ = &local_298;
            pcVar27 = (char *)std::__cxx11::string::_M_create
                                        ((ulong *)&referenceValue,(ulong)&resultValue);
            referenceValue.m_data[0] = SUB84(pcVar27,0);
            referenceValue.m_data[1] = (float)((ulong)pcVar27 >> 0x20);
            local_298._M_allocated_capacity._0_4_ = resultValue.m_data[0];
            local_298._M_allocated_capacity._4_4_ = resultValue.m_data[1];
            builtin_strncpy(pcVar27,"Low-quality result",0x12);
            referenceValue.m_data[2] = resultValue.m_data[0];
            referenceValue.m_data[3] = resultValue.m_data[1];
            pcVar27[resultValue.m_data._0_8_] = '\0';
            tcu::ResultCollector::addResult
                      (&pTVar36->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&referenceValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                              local_298._M_allocated_capacity + 1);
            }
          }
          bVar20 = false;
        }
        else {
          pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar3 = (ostringstream *)(referenceValue.m_data + 2);
          referenceValue.m_data[0] = SUB84(pTVar7,0);
          referenceValue.m_data[1] = (float)((ulong)pTVar7 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"ERROR: Result verification failed, got ",0x27);
          std::ostream::operator<<(poVar3,iVar37);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," invalid pixels!",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_230);
          iVar37 = 1;
          bVar20 = true;
        }
      }
      pTVar7 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      res.m_data = (float  [2])&local_510;
      local_510._M_allocated_capacity = 0x6552796669726556;
      local_510._8_4_ = 0x746c7573;
      local_510._M_local_buf[0xc] = '\0';
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      referenceValue.m_data[0] = 2.66247e-44;
      referenceValue.m_data[1] = 0.0;
      local_4f8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&referenceValue);
      local_4f8._M_string_length = CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]);
      *(undefined8 *)local_4f8._M_dataplus._M_p = 0x6163696669726556;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 8) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 9) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xc) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x11) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p + 0x12) = 't';
      local_4f8._M_dataplus._M_p[local_4f8._M_string_length] = '\0';
      local_4f8.field_2._M_allocated_capacity = local_4f8._M_string_length;
      tcu::LogImageSet::LogImageSet((LogImageSet *)&resultValue,(string *)&res,&local_4f8);
      tcu::TestLog::startImageSet(pTVar7,(char *)resultValue.m_data._0_8_,local_3b8._M_p);
      paVar2 = &local_480.field_2;
      local_480.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_480.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_480._M_string_length = 8;
      local_480.field_2._M_local_buf[8] = '\0';
      ppCVar5 = &srcLevelStorage_2.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x7265646e6552;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x6465;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0xe;
      pLVar33 = &local_348;
      local_480._M_dataplus._M_p = (pointer)paVar2;
      srcLevelStorage_2.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar5;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,&local_480,(string *)&srcLevelStorage_2,
                 (ConstPixelBufferAccess *)pLVar33,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,(int)pTVar7,__buf_05,(size_t)pLVar33);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_p != local_278) {
        operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                        local_298._M_allocated_capacity + 1);
      }
      if (srcLevelStorage_2.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar5) {
        operator_delete(srcLevelStorage_2.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT26(srcLevelStorage_2.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                 srcLevelStorage_2.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
      }
      local_45c = iVar37;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar2) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                 local_480.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resultValue.m_data._0_8_ != &local_3c8) {
        operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if (res.m_data != (float  [2])&local_510) {
        operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
      }
      if (bVar20) {
        pTVar7 = ((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        res.m_data = (float  [2])&local_510;
        local_510._M_allocated_capacity = 0x636e657265666552;
        local_510._8_2_ = 0x65;
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        resultValue.m_data[0] = 2.94273e-44;
        resultValue.m_data[1] = 0.0;
        local_4f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)&resultValue);
        local_4f8.field_2._M_allocated_capacity._0_4_ = resultValue.m_data[0];
        local_4f8.field_2._M_allocated_capacity._4_4_ = resultValue.m_data[1];
        *(undefined8 *)local_4f8._M_dataplus._M_p = 0x6572206c61656449;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 8) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xd) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xd) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x11) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x12) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x13) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p + 0x14) = 'e';
        local_4f8._M_string_length._0_4_ = resultValue.m_data[0];
        local_4f8._M_string_length._4_4_ = resultValue.m_data[1];
        local_4f8._M_dataplus._M_p[resultValue.m_data._0_8_] = '\0';
        pSVar32 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&res,&local_4f8,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar37 = (int)pTVar7;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar37,__buf_06,(size_t)pSVar32);
        local_480.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_480.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_480.field_2._M_local_buf[8] = 'k';
        local_480.field_2._M_local_buf[9] = '\0';
        local_480._M_string_length = 9;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x20726f727245;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x616d;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xa;
        pSVar32 = &errorMask;
        local_480._M_dataplus._M_p = (pointer)paVar2;
        srcLevelStorage_2.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar5;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,&local_480,(string *)&srcLevelStorage_2,pSVar32,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar37,__buf_07,(size_t)pSVar32);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)resultValue.m_data._0_8_ != &local_3c8) {
          operator_delete((void *)resultValue.m_data._0_8_,local_3c8._M_allocated_capacity + 1);
        }
        if (srcLevelStorage_2.
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar5) {
          operator_delete(srcLevelStorage_2.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT26(srcLevelStorage_2.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                   srcLevelStorage_2.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != paVar2) {
          operator_delete(local_480._M_dataplus._M_p,
                          CONCAT26(local_480.field_2._M_allocated_capacity._6_2_,
                                   local_480.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_p != local_278) {
          operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]) != &local_298) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(referenceValue.m_data[1],referenceValue.m_data[0]),
                          local_298._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if (res.m_data != (float  [2])&local_510) {
          operator_delete((void *)res.m_data,local_510._M_allocated_capacity + 1);
        }
      }
      pTVar36 = local_500;
      tcu::TestLog::endImageSet
                (((local_500->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&reference);
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar37 = local_45c;
      goto joined_r0x014ea0d8;
    }
  }
LAB_014ea0da:
  referenceValue.m_data._0_8_ = &local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&referenceValue,"Image verification failed","");
  tcu::ResultCollector::fail(&pTVar36->m_result,(string *)&referenceValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)referenceValue.m_data._0_8_ != &local_298) {
    operator_delete((void *)referenceValue.m_data._0_8_,local_298._M_allocated_capacity + 1);
  }
LAB_014ea135:
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureBorderClampTest::verifyImage (const tcu::Surface&							renderedFrame,
										  const IterationConfig&						config,
										  const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();

	tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
	std::vector<float>		texCoord;
	bool					verificationOk;

	glu::TextureTestUtil::computeQuadTexCoord2D(texCoord, config.p0, config.p1);

	lodPrecision.derivateBits		= 18;
	lodPrecision.lodBits			= 5;

	if (samplerParams.sampler.compare == tcu::Sampler::COMPAREMODE_NONE)
	{
		const tcu::TextureFormat		texFormat			= tcu::getEffectiveDepthStencilTextureFormat(m_texture->getRefTexture().getFormat(), m_sampleMode);
		const bool						isNearestMinFilter	= samplerParams.sampler.minFilter == tcu::Sampler::NEAREST || samplerParams.sampler.minFilter == tcu::Sampler::NEAREST_MIPMAP_NEAREST;
		const bool						isNearestMagFilter	= samplerParams.sampler.magFilter == tcu::Sampler::NEAREST;
		const bool						isNearestOnly		= isNearestMinFilter && isNearestMagFilter;
		const bool						isSRGB				= texFormat.order == tcu::TextureFormat::sRGB || texFormat.order == tcu::TextureFormat::sRGBA;
		const int						colorErrorBits		= (isNearestOnly && !isSRGB) ? (1) : (2);
		const tcu::IVec4				colorBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
		tcu::LookupPrecision			lookupPrecision;

		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / samplerParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,0);
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureSampleResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lodPrecision,
													   lookupPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lookupPrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}
	else
	{
		tcu::TexComparePrecision	texComparePrecision;
		tcu::TexComparePrecision	lowQualityTexComparePrecision;
		tcu::LodPrecision			lowQualityLodPrecision			= lodPrecision;

		texComparePrecision.coordBits					= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits						= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits						= 5;
		texComparePrecision.referenceBits				= 16;
		texComparePrecision.resultBits					= de::max(0, pixelFormat.redBits - 1);

		lowQualityTexComparePrecision.coordBits			= tcu::IVec3(20,20,0);
		lowQualityTexComparePrecision.uvwBits			= tcu::IVec3(4,4,0);
		lowQualityTexComparePrecision.pcfBits			= 0;
		lowQualityTexComparePrecision.referenceBits		= 16;
		lowQualityTexComparePrecision.resultBits		= de::max(0, pixelFormat.redBits - 1);

		lowQualityLodPrecision.lodBits					= 4;

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureCompareResult(renderedFrame.getAccess(),
														&texCoord[0],
														samplerParams,
														texComparePrecision,
														lowQualityTexComparePrecision,
														lodPrecision,
														lowQualityLodPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherCmpResult(renderedFrame.getAccess(),
														  &texCoord[0],
														  samplerParams,
														  texComparePrecision,
														  lowQualityTexComparePrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}

	if (!verificationOk)
		m_result.fail("Image verification failed");
}